

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_bpf_init(ma_bpf_config *pConfig,ma_allocation_callbacks *pAllocationCallbacks,
                     ma_bpf *pBPF)

{
  ma_bpf *pBPF_00;
  size_t *in_RDX;
  ma_bpf_config *in_RSI;
  void *pHeap;
  size_t heapSizeInBytes;
  ma_result result;
  size_t in_stack_ffffffffffffffc8;
  void *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  ma_result local_4;
  
  local_4 = ma_bpf_get_heap_size(in_RSI,in_RDX);
  if (local_4 == MA_SUCCESS) {
    if (in_stack_ffffffffffffffd0 == (void *)0x0) {
      pBPF_00 = (ma_bpf *)0x0;
    }
    else {
      pBPF_00 = (ma_bpf *)ma_malloc(in_stack_ffffffffffffffc8,(ma_allocation_callbacks *)0x219491);
      if (pBPF_00 == (ma_bpf *)0x0) {
        return MA_OUT_OF_MEMORY;
      }
    }
    local_4 = ma_bpf_init_preallocated
                        ((ma_bpf_config *)CONCAT44(local_4,in_stack_ffffffffffffffd8),
                         in_stack_ffffffffffffffd0,pBPF_00);
    if (local_4 == MA_SUCCESS) {
      *(undefined4 *)(in_RDX + 4) = 1;
      local_4 = MA_SUCCESS;
    }
    else {
      ma_free(in_stack_ffffffffffffffd0,(ma_allocation_callbacks *)pBPF_00);
    }
  }
  return local_4;
}

Assistant:

MA_API ma_result ma_bpf_init(const ma_bpf_config* pConfig, const ma_allocation_callbacks* pAllocationCallbacks, ma_bpf* pBPF)
{
    ma_result result;
    size_t heapSizeInBytes;
    void* pHeap;

    result = ma_bpf_get_heap_size(pConfig, &heapSizeInBytes);
    if (result != MA_SUCCESS) {
        return result;
    }

    if (heapSizeInBytes > 0) {
        pHeap = ma_malloc(heapSizeInBytes, pAllocationCallbacks);
        if (pHeap == NULL) {
            return MA_OUT_OF_MEMORY;
        }
    } else {
        pHeap = NULL;
    }

    result = ma_bpf_init_preallocated(pConfig, pHeap, pBPF);
    if (result != MA_SUCCESS) {
        ma_free(pHeap, pAllocationCallbacks);
        return result;
    }

    pBPF->_ownsHeap = MA_TRUE;
    return MA_SUCCESS;
}